

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  undefined7 uVar2;
  string *psVar3;
  char *__ptr;
  size_t sStack_160;
  allocator local_152;
  allocator local_151;
  undefined4 local_150;
  undefined4 local_14c;
  string local_148;
  string local_128;
  string parquetOutFile;
  string subFolder;
  sigaction sa;
  
  progname = *argv;
  subFolder._M_dataplus._M_p = (pointer)&subFolder.field_2;
  subFolder._M_string_length = 0;
  parquetOutFile._M_dataplus._M_p = (pointer)&parquetOutFile.field_2;
  parquetOutFile._M_string_length = 0;
  subFolder.field_2._M_local_buf[0] = '\0';
  local_14c = 0;
  parquetOutFile.field_2._M_local_buf[0] = '\0';
  local_150 = 0;
LAB_001036ce:
  do {
    iVar1 = getopt(argc,argv,"osvhK:p:");
    uVar2 = (undefined7)
            ((ulong)((long)&switchD_001036ea::switchdataD_00104158 +
                    (long)(int)(&switchD_001036ea::switchdataD_00104158)[iVar1 - 0x6f]) >> 8);
    switch(iVar1) {
    case 0x6f:
      local_150 = (undefined4)CONCAT71(uVar2,1);
      goto LAB_001036ce;
    case 0x70:
      psVar3 = &parquetOutFile;
      break;
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x75:
switchD_001036ea_caseD_71:
      help();
LAB_001038a1:
      exit(1);
    case 0x73:
      goto switchD_001036ea_caseD_73;
    case 0x76:
      fprintf(_stderr,"%s: version: %s\n",*argv,"");
      goto LAB_001038a1;
    default:
      psVar3 = &subFolder;
      if (iVar1 != 0x4b) {
        if (iVar1 == -1) {
          if (subFolder._M_string_length == 0) {
            __ptr = "FATAL: No folder supplied for summarycalc files\n";
            sStack_160 = 0x30;
          }
          else {
            if (parquetOutFile._M_string_length == 0) {
              memset(&sa,0,0x98);
              sigemptyset((sigset_t *)&sa.sa_mask);
              sa.__sigaction_handler.sa_handler = segfault_sigaction;
              sa.sa_flags = 4;
              sigaction(0xb,(sigaction *)&sa,(sigaction *)0x0);
              std::__cxx11::string::string((string *)&local_128,progname,&local_151);
              std::__cxx11::string::string((string *)&local_148,"INFO",&local_152);
              logprintf(&local_128,&local_148,"starting process..\n");
              std::__cxx11::string::~string((string *)&local_148);
              std::__cxx11::string::~string((string *)&local_128);
              aalcalcmeanonly::DoIt
                        (&subFolder,(bool)((byte)local_14c & 1),(bool)((byte)local_150 & 1),
                         &parquetOutFile);
              std::__cxx11::string::string((string *)&local_128,progname,&local_151);
              std::__cxx11::string::string((string *)&local_148,"INFO",&local_152);
              logprintf(&local_128,&local_148,"finishing process..\n");
              std::__cxx11::string::~string((string *)&local_148);
              std::__cxx11::string::~string((string *)&local_128);
              std::__cxx11::string::~string((string *)&parquetOutFile);
              std::__cxx11::string::~string((string *)&subFolder);
              return 0;
            }
            __ptr = 
            "FATAL: Apache arrow libraries for parquet output are missing.\nPlease install libraries and recompile to use this option.\n"
            ;
            sStack_160 = 0x79;
          }
          fwrite(__ptr,sStack_160,1,_stderr);
          goto LAB_001038a1;
        }
        goto switchD_001036ea_caseD_71;
      }
    }
    std::__cxx11::string::assign((char *)psVar3);
  } while( true );
switchD_001036ea_caseD_73:
  local_14c = (undefined4)CONCAT71(uVar2,1);
  goto LAB_001036ce;
}

Assistant:

int main(int argc, char* argv[]) {

  progname = argv[0];
  std::string subFolder;
  int opt;
  bool skipHeader = false;
  bool ordOutput = false;
  std::string parquetOutFile;

  while ((opt = getopt(argc, argv, (char *)"osvhK:p:")) != -1) {
    switch (opt) {
      case 'v':
#ifdef HAVE_PARQUET
        fprintf(stderr, "%s : version: %s : Parquet output enabled\n",
                argv[0], VERSION);
#else
        fprintf(stderr, "%s: version: %s\n", argv[0], VERSION);
#endif
	exit(EXIT_FAILURE);
      case 's':
        skipHeader = true;
        break;
      case 'o':
        ordOutput = true;
        break;
      case 'K':
        subFolder = optarg;
        break;
      case 'p':
        parquetOutFile = optarg;
	break;
      case 'h':
      default:
	help();
	exit(EXIT_FAILURE);
    }
  }

  if (subFolder.length() == 0) {
    fprintf(stderr, "FATAL: No folder supplied for summarycalc files\n");
    exit(EXIT_FAILURE);
  }

#ifndef HAVE_PARQUET
  if (!parquetOutFile.empty()) {
    fprintf(stderr, "FATAL: Apache arrow libraries for parquet output are missing.\n"
                    "Please install libraries and recompile to use this option.\n");
    exit(EXIT_FAILURE);
  }
#endif

#if !defined(_MSC_VER) && !defined(__MINGW32__)
  struct sigaction sa;

  memset(&sa, 0, sizeof(struct sigaction));
  sigemptyset(&sa.sa_mask);
  sa.sa_sigaction = segfault_sigaction;
  sa.sa_flags = SA_SIGINFO;

  sigaction(SIGSEGV, &sa, NULL);
#endif

  try {
    logprintf(progname, "INFO", "starting process..\n");
    aalcalcmeanonly::DoIt(subFolder, skipHeader, ordOutput, parquetOutFile);
    logprintf(progname, "INFO", "finishing process..\n");
  } catch (std::bad_alloc&) {
    fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
    exit(EXIT_FAILURE);
  }

  return EXIT_SUCCESS;

}